

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O3

void audio_make_sane(int *ndev,int *devvec,int *nchan,int *chanvec,int maxdev)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = *ndev;
  lVar3 = (long)iVar2;
  iVar1 = *nchan;
  lVar4 = (long)iVar1;
  if (lVar3 == -1) {
    if (iVar1 != -1) {
      devvec[0] = 0;
      devvec[1] = 1;
      devvec[2] = 2;
      devvec[3] = 3;
LAB_001705d2:
      iVar2 = *nchan;
LAB_001705d5:
      *ndev = iVar2;
      goto LAB_001705d7;
    }
    iVar2 = 0;
    *nchan = 0;
    *ndev = 0;
  }
  else {
    if (iVar1 == -1) {
      *nchan = iVar2;
      iVar2 = *ndev;
      if (iVar2 < 1) goto LAB_001705e5;
      lVar3 = 0;
      do {
        chanvec[lVar3] = 2;
        lVar3 = lVar3 + 1;
        iVar2 = *ndev;
      } while (lVar3 < iVar2);
    }
    else {
      if (iVar2 < iVar1) {
        do {
          if (lVar3 == 0) {
            *devvec = 0;
          }
          else {
            devvec[lVar3] = devvec[lVar3 + -1] + 1;
          }
          lVar3 = lVar3 + 1;
          iVar2 = *nchan;
        } while (lVar3 < iVar2);
        goto LAB_001705d5;
      }
      if (iVar1 < iVar2) {
        do {
          if (lVar4 == 0) {
            *chanvec = 2;
          }
          else {
            chanvec[lVar4] = chanvec[lVar4 + -1];
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < *ndev);
        goto LAB_001705d2;
      }
    }
LAB_001705d7:
    if (3 < iVar2) goto LAB_00170604;
  }
LAB_001705e5:
  memset(devvec + iVar2,0xff,(ulong)(3 - iVar2) * 4 + 4);
LAB_00170604:
  iVar1 = *nchan;
  if (3 < (long)iVar1) {
    return;
  }
  memset(chanvec + iVar1,0,(ulong)(3 - iVar1) * 4 + 4);
  return;
}

Assistant:

static void audio_make_sane(int *ndev, int *devvec,
    int *nchan, int *chanvec, int maxdev)
{
    int i;
    if (*ndev == -1)
    {           /* no input audio devices specified */
        if (*nchan == -1)
        {
            if (*ndev >= 1)
            {
                *nchan=1;
                chanvec[0] = SYS_DEFAULTCH;
                *ndev = 1;
                devvec[0] = DEFAULTAUDIODEV;
            }
            else *ndev = *nchan = 0;
        }
        else
        {
            for (i = 0; i < maxdev; i++)
                devvec[i] = i;
            *ndev = *nchan;
        }
    }
    else
    {
        if (*nchan == -1)
        {
            *nchan = *ndev;
            for (i = 0; i < *ndev; i++)
                chanvec[i] = SYS_DEFAULTCH;
        }
        else if (*nchan > *ndev)
        {
            for (i = *ndev; i < *nchan; i++)
            {
                if (i == 0)
                    devvec[0] = DEFAULTAUDIODEV;
                else devvec[i] = devvec[i-1] + 1;
            }
            *ndev = *nchan;
        }
        else if (*nchan < *ndev)
        {
            for (i = *nchan; i < *ndev; i++)
            {
                if (i == 0)
                    chanvec[0] = SYS_DEFAULTCH;
                else chanvec[i] = chanvec[i-1];
            }
            *ndev = *nchan;
        }
    }
    for (i = *ndev; i < maxdev; i++)
        devvec[i] = -1;
    for (i = *nchan; i < maxdev; i++)
        chanvec[i] = 0;

}